

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<6ul>
                    (uint8_t *buffer,uint64_t *value)

{
  string *psVar1;
  uint64_t uVar2;
  size_t offset;
  long lVar3;
  byte *pbVar4;
  int local_24;
  unsigned_long local_20 [2];
  
  local_20[0] = 6;
  local_24 = 0;
  psVar1 = absl::lts_20240722::log_internal::Check_GTImpl<unsigned_long,int>
                     (local_20,&local_24,"N > 0");
  if (psVar1 == (string *)0x0) {
    uVar2 = (ulong)buffer[5] << 0x23;
    pbVar4 = buffer;
    for (lVar3 = 0; lVar3 != 0x23; lVar3 = lVar3 + 7) {
      uVar2 = uVar2 + ((ulong)*pbVar4 - 0x80 << ((byte)lVar3 & 0x3f));
      pbVar4 = pbVar4 + 1;
    }
    *value = uVar2;
    return buffer + 6;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
             ,0x198,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

const uint8_t* DecodeVarint64KnownSize(const uint8_t* buffer, uint64_t* value) {
  ABSL_DCHECK_GT(N, 0);
  uint64_t result = static_cast<uint64_t>(buffer[N - 1]) << (7 * (N - 1));
  for (size_t i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64_t>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}